

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
process<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&>
          (OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_1,int *tail_2)

{
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_RCX;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  process<std::__cxx11::string&>(in_RDI,in_stack_ffffffffffffffc8);
  process<std::__cxx11::string&,std::__cxx11::string&,int&>
            (in_RCX,in_R8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (int *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        self->process( std::forward<T>( head ) );
        self->process( std::forward<Other>( tail )... );
      }